

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdtrans.c
# Opt level: O0

jvirt_barray_ptr * jpeg_read_coefficients(j_decompress_ptr cinfo)

{
  int iVar1;
  long lVar2;
  j_decompress_ptr in_RDI;
  int retcode;
  jvirt_barray_ptr *local_8;
  
  if (in_RDI->global_state == 0xca) {
    transdecode_master_selection(in_RDI);
    in_RDI->global_state = 0xd1;
  }
  if (in_RDI->global_state == 0xd1) {
    while( true ) {
      if (in_RDI->progress != (jpeg_progress_mgr *)0x0) {
        (*in_RDI->progress->progress_monitor)((j_common_ptr)in_RDI);
      }
      iVar1 = (*in_RDI->inputctl->consume_input)(in_RDI);
      if (iVar1 == 0) {
        return (jvirt_barray_ptr *)0x0;
      }
      if (iVar1 == 2) break;
      if ((in_RDI->progress != (jpeg_progress_mgr *)0x0) &&
         (((iVar1 == 3 || (iVar1 == 1)) &&
          (lVar2 = in_RDI->progress->pass_counter + 1, in_RDI->progress->pass_counter = lVar2,
          in_RDI->progress->pass_limit <= lVar2)))) {
        in_RDI->progress->pass_limit = (ulong)in_RDI->total_iMCU_rows + in_RDI->progress->pass_limit
        ;
      }
    }
    in_RDI->global_state = 0xd2;
  }
  if (((in_RDI->global_state == 0xd2) || (in_RDI->global_state == 0xcf)) &&
     (in_RDI->buffered_image != 0)) {
    local_8 = in_RDI->coef->coef_arrays;
  }
  else {
    in_RDI->err->msg_code = 0x14;
    (in_RDI->err->msg_parm).i[0] = in_RDI->global_state;
    (*in_RDI->err->error_exit)((j_common_ptr)in_RDI);
    local_8 = (jvirt_barray_ptr *)0x0;
  }
  return local_8;
}

Assistant:

GLOBAL(jvirt_barray_ptr *)
jpeg_read_coefficients(j_decompress_ptr cinfo)
{
  if (cinfo->global_state == DSTATE_READY) {
    /* First call: initialize active modules */
    transdecode_master_selection(cinfo);
    cinfo->global_state = DSTATE_RDCOEFS;
  }
  if (cinfo->global_state == DSTATE_RDCOEFS) {
    /* Absorb whole file into the coef buffer */
    for (;;) {
      int retcode;
      /* Call progress monitor hook if present */
      if (cinfo->progress != NULL)
        (*cinfo->progress->progress_monitor) ((j_common_ptr)cinfo);
      /* Absorb some more input */
      retcode = (*cinfo->inputctl->consume_input) (cinfo);
      if (retcode == JPEG_SUSPENDED)
        return NULL;
      if (retcode == JPEG_REACHED_EOI)
        break;
      /* Advance progress counter if appropriate */
      if (cinfo->progress != NULL &&
          (retcode == JPEG_ROW_COMPLETED || retcode == JPEG_REACHED_SOS)) {
        if (++cinfo->progress->pass_counter >= cinfo->progress->pass_limit) {
          /* startup underestimated number of scans; ratchet up one scan */
          cinfo->progress->pass_limit += (long)cinfo->total_iMCU_rows;
        }
      }
    }
    /* Set state so that jpeg_finish_decompress does the right thing */
    cinfo->global_state = DSTATE_STOPPING;
  }
  /* At this point we should be in state DSTATE_STOPPING if being used
   * standalone, or in state DSTATE_BUFIMAGE if being invoked to get access
   * to the coefficients during a full buffered-image-mode decompression.
   */
  if ((cinfo->global_state == DSTATE_STOPPING ||
       cinfo->global_state == DSTATE_BUFIMAGE) && cinfo->buffered_image) {
    return cinfo->coef->coef_arrays;
  }
  /* Oops, improper usage */
  ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  return NULL;                  /* keep compiler happy */
}